

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.h
# Opt level: O0

void __thiscall FS::StateStack::pop(StateStack *this)

{
  bool bVar1;
  size_type sVar2;
  StateArg local_20;
  StateArg local_18;
  StateStack *local_10;
  StateStack *this_local;
  
  local_10 = this;
  std::vector<FS::StateStack::CommandPacket,_std::allocator<FS::StateStack::CommandPacket>_>::
  pop_back(&this->stack);
  sVar2 = std::vector<FS::StateStack::CommandPacket,_std::allocator<FS::StateStack::CommandPacket>_>
          ::size(&this->stack);
  if (10 < sVar2) {
    StateArg::StateArg(&local_18,0x106);
    push(this,ERROR_STATE,local_18);
  }
  bVar1 = std::vector<FS::StateStack::CommandPacket,_std::allocator<FS::StateStack::CommandPacket>_>
          ::empty(&this->stack);
  if (bVar1) {
    StateArg::StateArg(&local_20,0x10b);
    push(this,ERROR_STATE,local_20);
  }
  return;
}

Assistant:

void pop( void )
  {
    stack.pop_back();
    if ( stack.size() > 10 ) 
    {
      push( State::ERROR_STATE, StateArg(__LINE__) ); 
    }
    if ( stack.empty() ) 
    {
      // bug, should never happen.
      push( State::ERROR_STATE, StateArg(__LINE__) ); 
    }
  }